

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O0

QPDFObjectHandle __thiscall
QPDF::getUncompressedObject(QPDF *this,QPDFObjectHandle *oh,ObjTable *obj)

{
  int iVar1;
  bool bVar2;
  Object *pOVar3;
  ObjTable<QPDFWriter::Object> *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  QPDFObjectHandle QVar5;
  QPDFObjectHandle local_58;
  int local_48;
  int id;
  QPDFObjectHandle local_38;
  ObjTable<QPDFWriter::Object> *local_28;
  ObjTable *obj_local;
  QPDFObjectHandle *oh_local;
  QPDF *this_local;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  
  local_28 = in_RCX;
  obj_local = obj;
  oh_local = oh;
  this_local = this;
  QPDFObjectHandle::QPDFObjectHandle(&local_38,(QPDFObjectHandle *)obj);
  bVar2 = ObjTable<QPDFWriter::Object>::contains(in_RCX,&local_38);
  QPDFObjectHandle::~QPDFObjectHandle(&local_38);
  if (bVar2) {
    QPDFObjectHandle::QPDFObjectHandle(&local_58,(QPDFObjectHandle *)obj_local);
    pOVar3 = ObjTable<QPDFWriter::Object>::operator[](local_28,&local_58);
    iVar1 = pOVar3->object_stream;
    QPDFObjectHandle::~QPDFObjectHandle(&local_58);
    local_48 = iVar1;
    if (0 < iVar1) {
      bVar2 = QPDFObjectHandle::isNull((QPDFObjectHandle *)obj_local);
      if (bVar2) {
        QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)this,(QPDFObjectHandle *)obj_local);
        _Var4._M_pi = extraout_RDX;
      }
      else {
        QVar5 = getObject(this,(int)oh,local_48);
        _Var4._M_pi = QVar5.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      }
      goto LAB_00364da0;
    }
  }
  QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)this,(QPDFObjectHandle *)obj_local);
  _Var4._M_pi = extraout_RDX_00;
LAB_00364da0:
  QVar5.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var4._M_pi;
  QVar5.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar5.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDF::getUncompressedObject(QPDFObjectHandle& oh, QPDFWriter::ObjTable const& obj)
{
    if (obj.contains(oh)) {
        if (auto id = obj[oh].object_stream; id > 0) {
            return oh.isNull() ? oh : getObject(id, 0);
        }
    }
    return oh;
}